

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_list.cpp
# Opt level: O3

void __thiscall
duckdb::SimpleMultiFileList::SimpleMultiFileList
          (SimpleMultiFileList *this,vector<duckdb::OpenFileInfo,_true> *paths_p)

{
  pointer pOVar1;
  pointer pOVar2;
  pointer pOVar3;
  vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_> local_28;
  
  pOVar1 = (paths_p->super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>).
           super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  pOVar2 = (paths_p->super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>).
           super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
           super__Vector_impl_data._M_start;
  pOVar3 = (paths_p->super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>).
           super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (paths_p->super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>).
  super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (paths_p->super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>).
  super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (paths_p->super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>).
  super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_MultiFileList)._vptr_MultiFileList = (_func_int **)&PTR__MultiFileList_02463f60;
  (this->super_MultiFileList).paths.
  super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
  super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
  super__Vector_impl_data._M_start = pOVar2;
  (this->super_MultiFileList).paths.
  super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
  super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = pOVar3;
  (this->super_MultiFileList).paths.
  super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
  super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pOVar1;
  local_28.super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_28.super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_MultiFileList).glob_options = ALLOW_EMPTY;
  std::vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>::~vector(&local_28);
  (this->super_MultiFileList)._vptr_MultiFileList = (_func_int **)&PTR__MultiFileList_02463fb8;
  return;
}

Assistant:

SimpleMultiFileList::SimpleMultiFileList(vector<OpenFileInfo> paths_p)
    : MultiFileList(std::move(paths_p), FileGlobOptions::ALLOW_EMPTY) {
}